

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void mcbsp_get_tag(mcbsp_size_t *status,void *tag)

{
  bool bVar1;
  size_t __n;
  size_t sVar2;
  void *__src;
  size_t tag_size;
  void *tag_local;
  mcbsp_size_t *status_local;
  
  if ((s_spmd == (Spmd *)0x0) || (bVar1 = bsplib::Spmd::closed(s_spmd), bVar1)) {
    bsp_abort("bsp_get_tag: can only be called within SPMD section\n");
  }
  if (status == (mcbsp_size_t *)0x0) {
    bsp_abort("bsp_get_tag: first arguments may not be NULL\n");
  }
  __n = bsplib::Bsmp::recv_tag_size(s_bsmp);
  if ((tag == (void *)0x0) && (__n != 0)) {
    bsp_abort("bsp_get_tag: tag must point to a block of available memory of at least %zu bytes long\n"
              ,__n);
  }
  bVar1 = bsplib::Bsmp::empty(s_bsmp);
  if (bVar1) {
    *status = 0xffffffffffffffff;
  }
  else {
    sVar2 = bsplib::Bsmp::payload_size(s_bsmp);
    *status = sVar2;
    __src = bsplib::Bsmp::tag(s_bsmp);
    memcpy(tag,__src,__n);
  }
  return;
}

Assistant:

void mcbsp_get_tag( mcbsp_size_t * status, void * tag )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_get_tag: can only be called within SPMD section\n");

#ifdef PROFILE
    TicToc t( TicToc::BSMP, s_bsmp->recv_tag_size() );
#endif

    if ( status == NULL )
        bsp_abort("bsp_get_tag: first arguments may not be NULL\n");

    size_t tag_size = s_bsmp->recv_tag_size();
    if ( tag == NULL && tag_size  > 0 )
        bsp_abort("bsp_get_tag: tag must point to a block of available "
                "memory of at least %zu bytes long\n", tag_size );

    if ( s_bsmp->empty() ) {
        *status = mcbsp_size_t(-1);
    }
    else {
        *status = s_bsmp->payload_size();
        std::memcpy( tag, s_bsmp->tag(), tag_size );
    }
}